

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::EdgeSensitivePathSuffixSyntax::setChild
          (EdgeSensitivePathSuffixSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00ae7e48 + *(int *)(&DAT_00ae7e48 + in_RSI * 4)))();
  return;
}

Assistant:

void EdgeSensitivePathSuffixSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: outputs = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 2: polarityOperator = child.token(); return;
        case 3: colon = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}